

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

size_t __thiscall efsw::String::find_first_of(String *this,char *s,size_t pos)

{
  char32_t *pcVar1;
  char32_t cVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t __i;
  size_type sVar6;
  String local_38;
  
  String(&local_38,s);
  uVar3 = (this->mString)._M_string_length;
  uVar5 = 0xffffffffffffffff;
  if (pos < uVar3 && local_38.mString._M_string_length != 0) {
    uVar4 = CONCAT71((int7)((ulong)s >> 8),pos < uVar3 && local_38.mString._M_string_length != 0);
    do {
      cVar2 = (this->mString)._M_dataplus._M_p[pos];
      sVar6 = 0;
      do {
        pcVar1 = local_38.mString._M_dataplus._M_p + sVar6;
        uVar5 = pos;
        if (*pcVar1 == cVar2) break;
        sVar6 = sVar6 + 1;
        uVar5 = uVar4;
      } while (local_38.mString._M_string_length != sVar6);
    } while ((*pcVar1 != cVar2) &&
            (pos = pos + 1, uVar4 = uVar5, uVar5 = 0xffffffffffffffff, pos != uVar3));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_38.mString._M_dataplus._M_p != &local_38.mString.field_2) {
    operator_delete(local_38.mString._M_dataplus._M_p);
  }
  return uVar5;
}

Assistant:

std::size_t String::find_first_of( const char* s, std::size_t pos ) const {
	return find_first_of( String( s ), pos );
}